

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcDispatch.cpp
# Opt level: O2

void __thiscall XmlRpc::XmlRpcDispatch::work(XmlRpcDispatch *this,double timeout)

{
  ushort uVar1;
  long *plVar2;
  pointer ppVar3;
  int __timeout;
  uint uVar4;
  uint uVar5;
  long lVar6;
  int *piVar7;
  XmlRpcDispatch *pXVar8;
  const_iterator __position;
  char *this_00;
  ulong uVar9;
  ulong __n;
  XmlRpcDispatch *pXVar10;
  double dVar11;
  vector<XmlRpc::XmlRpcSource_*,_std::allocator<XmlRpc::XmlRpcSource_*>_> sources;
  vector<pollfd,_std::allocator<pollfd>_> fds;
  SourceList closeList;
  
  if (0.0 <= timeout) {
    dVar11 = getTime(this);
    dVar11 = dVar11 + timeout;
  }
  else {
    dVar11 = -1.0;
  }
  this->_endTime = dVar11;
  this->_doClear = false;
  this->_inWork = true;
  dVar11 = floor(timeout * 1000.0);
  __timeout = (int)dVar11;
  if (__timeout < 0) {
    __timeout = -1;
  }
  do {
    if ((XmlRpcDispatch *)
        (this->_sources).
        super__List_base<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
        ._M_impl._M_node.super__List_node_base._M_next == this) {
LAB_00285298:
      this->_inWork = false;
      return;
    }
    __n = (ulong)(uint)(this->_sources).
                       super__List_base<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
                       ._M_impl._M_node._M_size;
    std::vector<pollfd,_std::allocator<pollfd>_>::vector(&fds,__n,(allocator_type *)&sources);
    std::vector<XmlRpc::XmlRpcSource_*,_std::allocator<XmlRpc::XmlRpcSource_*>_>::vector
              (&sources,__n,(allocator_type *)&closeList);
    lVar6 = 0;
    pXVar8 = this;
    while (pXVar8 = (XmlRpcDispatch *)
                    (pXVar8->_sources).
                    super__List_base<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
                    ._M_impl._M_node.super__List_node_base._M_next, pXVar8 != this) {
      *(size_t *)
       ((long)sources.
              super__Vector_base<XmlRpc::XmlRpcSource_*,_std::allocator<XmlRpc::XmlRpcSource_*>_>.
              _M_impl.super__Vector_impl_data._M_start + lVar6) =
           (pXVar8->_sources).
           super__List_base<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
           ._M_impl._M_node._M_size;
      *(undefined4 *)
       ((long)&(fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                super__Vector_impl_data._M_start)->fd + lVar6) =
           *(undefined4 *)
            (*(long *)((long)sources.
                             super__Vector_base<XmlRpc::XmlRpcSource_*,_std::allocator<XmlRpc::XmlRpcSource_*>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar6) + 8);
      *(undefined4 *)
       ((long)&(fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                super__Vector_impl_data._M_start)->events + lVar6) = 0;
      uVar1 = *(ushort *)&pXVar8->_endTime;
      *(ushort *)
       ((long)&(fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                super__Vector_impl_data._M_start)->events + lVar6) =
           uVar1 >> 1 & 2 | (uVar1 & 1) + (uVar1 & 2) * 2;
      lVar6 = lVar6 + 8;
    }
    this_00 = (char *)fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                      super__Vector_impl_data._M_start;
    uVar4 = poll((pollfd *)
                 fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                 super__Vector_impl_data._M_start,__n,__timeout);
    if ((int)uVar4 < 0) {
      piVar7 = __errno_location();
      if (*piVar7 != 4) {
        XmlRpcUtil::error("Error in XmlRpcDispatch::work: error in poll (%d).",(ulong)uVar4);
      }
      this->_inWork = false;
      std::_Vector_base<XmlRpc::XmlRpcSource_*,_std::allocator<XmlRpc::XmlRpcSource_*>_>::
      ~_Vector_base(&sources.
                     super__Vector_base<XmlRpc::XmlRpcSource_*,_std::allocator<XmlRpc::XmlRpcSource_*>_>
                   );
      std::_Vector_base<pollfd,_std::allocator<pollfd>_>::~_Vector_base
                (&fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>);
      return;
    }
    for (uVar9 = 0;
        ppVar3 = fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                 super__Vector_impl_data._M_start, uVar9 != __n; uVar9 = uVar9 + 1) {
      pXVar8 = (XmlRpcDispatch *)
               sources.
               super__Vector_base<XmlRpc::XmlRpcSource_*,_std::allocator<XmlRpc::XmlRpcSource_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar9];
      uVar1 = fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
              super__Vector_impl_data._M_start[uVar9].events;
      uVar4 = 0xffffffff;
      if (((uVar1 & 1) != 0) &&
         ((fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.super__Vector_impl_data.
           _M_start[uVar9].revents & 0x19) != 0)) {
        this_00 = (char *)pXVar8;
        uVar4 = (*(code *)(pXVar8->_sources).
                          super__List_base<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
                          ._M_impl._M_node.super__List_node_base._M_next[1]._M_prev)(pXVar8,1);
      }
      if (((uVar1 & 4) != 0) && ((ppVar3[uVar9].revents & 0xc) != 0)) {
        this_00 = (char *)pXVar8;
        uVar5 = (*(code *)(pXVar8->_sources).
                          super__List_base<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
                          ._M_impl._M_node.super__List_node_base._M_next[1]._M_prev)(pXVar8,2);
        uVar4 = uVar4 & uVar5;
      }
      __position._M_node = (_List_node_base *)this;
      if (((uVar1 & 2) != 0) && ((ppVar3[uVar9].revents & 0x22) != 0)) {
        this_00 = (char *)pXVar8;
        uVar5 = (*(code *)(pXVar8->_sources).
                          super__List_base<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
                          ._M_impl._M_node.super__List_node_base._M_next[1]._M_prev)(pXVar8,4);
        uVar4 = uVar4 & uVar5;
      }
      do {
        __position._M_node =
             (((XmlRpcDispatch *)__position._M_node)->_sources).
             super__List_base<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
             ._M_impl._M_node.super__List_node_base._M_next;
        if ((XmlRpcDispatch *)__position._M_node == this) {
          this_00 = "Error in XmlRpcDispatch::work: couldn\'t find source iterator";
          XmlRpcUtil::error("Error in XmlRpcDispatch::work: couldn\'t find source iterator");
          goto LAB_002851c2;
        }
      } while ((XmlRpcDispatch *)__position._M_node[1]._M_next != pXVar8);
      if (uVar4 != 0xffffffff) {
        if (uVar4 == 0) {
          this_00 = (char *)this;
          std::__cxx11::
          list<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
          ::erase(&this->_sources,__position);
          if (*(char *)((long)&(pXVar8->_sources).
                               super__List_base<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
                               ._M_impl._M_node.super__List_node_base._M_prev + 5) == '\0') {
            (*(code *)(pXVar8->_sources).
                      super__List_base<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
                      ._M_impl._M_node.super__List_node_base._M_next[1]._M_next)();
            this_00 = (char *)pXVar8;
          }
        }
        else {
          *(uint *)&__position._M_node[1]._M_prev = uVar4;
        }
      }
LAB_002851c2:
    }
    pXVar8 = (XmlRpcDispatch *)&closeList;
    if (this->_doClear == true) {
      std::__cxx11::
      list<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
      ::list((list<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
              *)pXVar8,&this->_sources);
      std::__cxx11::
      list<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
      ::clear(&this->_sources);
      pXVar10 = pXVar8;
      while (pXVar10 = (XmlRpcDispatch *)
                       (((_List_impl *)&pXVar10->_sources)->_M_node).super__List_node_base._M_next,
            pXVar10 != pXVar8) {
        plVar2 = (long *)(pXVar10->_sources).
                         super__List_base<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
                         ._M_impl._M_node._M_size;
        if (plVar2 != (long *)0x0) {
          (**(code **)(*plVar2 + 0x10))();
        }
      }
      this->_doClear = false;
      std::__cxx11::
      _List_base<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
      ::_M_clear((_List_base<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
                  *)pXVar8);
      this_00 = (char *)pXVar8;
    }
    if ((0.0 <= this->_endTime) &&
       (dVar11 = getTime((XmlRpcDispatch *)this_00),
       this->_endTime <= dVar11 && dVar11 != this->_endTime)) {
      std::_Vector_base<XmlRpc::XmlRpcSource_*,_std::allocator<XmlRpc::XmlRpcSource_*>_>::
      ~_Vector_base(&sources.
                     super__Vector_base<XmlRpc::XmlRpcSource_*,_std::allocator<XmlRpc::XmlRpcSource_*>_>
                   );
      std::_Vector_base<pollfd,_std::allocator<pollfd>_>::~_Vector_base
                (&fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>);
      goto LAB_00285298;
    }
    std::_Vector_base<XmlRpc::XmlRpcSource_*,_std::allocator<XmlRpc::XmlRpcSource_*>_>::
    ~_Vector_base(&sources.
                   super__Vector_base<XmlRpc::XmlRpcSource_*,_std::allocator<XmlRpc::XmlRpcSource_*>_>
                 );
    std::_Vector_base<pollfd,_std::allocator<pollfd>_>::~_Vector_base
              (&fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>);
  } while( true );
}

Assistant:

void XmlRpcDispatch::work(double timeout)
{
  // Loosely based on `man select` > Correspondence between select() and poll() notifications
  // and cloudius-systems/osv#35, cloudius-systems/osv@b53d39a using poll to emulate select
  const unsigned POLLIN_REQ = POLLIN; // Request read
  const unsigned POLLIN_CHK = (POLLIN | POLLHUP | POLLERR); // Readable or connection lost
  const unsigned POLLOUT_REQ = POLLOUT; // Request write
  const unsigned POLLOUT_CHK = (POLLOUT | POLLERR); // Writable or connection lost
#if !defined(_WIN32)
  const unsigned POLLEX_REQ = POLLPRI; // Out-of-band data received
  const unsigned POLLEX_CHK = (POLLPRI | POLLNVAL); // Out-of-band data or invalid fd
#else
  const unsigned POLLEX_REQ = POLLRDBAND; // Out-of-band data received
  const unsigned POLLEX_CHK = (POLLRDBAND | POLLNVAL); // Out-of-band data or invalid fd
#endif

  // Compute end time
  _endTime = (timeout < 0.0) ? -1.0 : (getTime() + timeout);
  _doClear = false;
  _inWork = true;
  int timeout_ms = static_cast<int>(floor(timeout * 1000.));

  // Only work while there is something to monitor
  while (!_sources.empty()) {

    // Construct the sets of descriptors we are interested in
    const unsigned source_cnt = _sources.size();
    std::vector<pollfd> fds(source_cnt);
    std::vector<XmlRpcSource *> sources(source_cnt);

    SourceList::iterator it;
    std::size_t i = 0;
    for (it=_sources.begin(); it!=_sources.end(); ++it, ++i) {
      sources[i] = it->getSource();
      fds[i].fd = sources[i]->getfd();
      fds[i].revents = 0; // some platforms may not clear this in poll()
      fds[i].events = 0;
      unsigned mask = it->getMask();
      if (mask & ReadableEvent)
        fds[i].events |= POLLIN_REQ;
      if (mask & WritableEvent)
        fds[i].events |= POLLOUT_REQ;
      if (mask & Exception)
        fds[i].events |= POLLEX_REQ;
    }

    // Check for events
    int nEvents = poll(&fds[0], source_cnt, (timeout_ms < 0) ? -1 : timeout_ms);

    if (nEvents < 0)
    {
#if defined(_WIN32)
      XmlRpcUtil::error("Error in XmlRpcDispatch::work: error in poll (%d).", WSAGetLastError());
#else
      if(errno != EINTR)
        XmlRpcUtil::error("Error in XmlRpcDispatch::work: error in poll (%d).", nEvents);
#endif
      _inWork = false;
      return;
    }

    // Process events
    for (i=0; i < source_cnt; ++i)
    {
      XmlRpcSource* src = sources[i];
      pollfd & pfd = fds[i];
      unsigned newMask = (unsigned) -1;
      // Only handle requested events to avoid being prematurely removed from dispatch
      bool readable = (pfd.events & POLLIN_REQ) == POLLIN_REQ;
      bool writable = (pfd.events & POLLOUT_REQ) == POLLOUT_REQ;
      bool oob = (pfd.events & POLLEX_REQ) == POLLEX_REQ;
      if (readable && (pfd.revents & POLLIN_CHK))
        newMask &= src->handleEvent(ReadableEvent);
      if (writable && (pfd.revents & POLLOUT_CHK))
        newMask &= src->handleEvent(WritableEvent);
      if (oob && (pfd.revents & POLLEX_CHK))
        newMask &= src->handleEvent(Exception);

      // Find the source iterator. It may have moved as a result of the way
      // that sources are removed and added in the call stack starting
      // from the handleEvent() calls above.
      SourceList::iterator thisIt;
      for (thisIt = _sources.begin(); thisIt != _sources.end(); thisIt++)
      {
        if(thisIt->getSource() == src)
          break;
      }
      if(thisIt == _sources.end())
      {
        XmlRpcUtil::error("Error in XmlRpcDispatch::work: couldn't find source iterator");
        continue;
      }

      if ( ! newMask) {
        _sources.erase(thisIt);  // Stop monitoring this one
        if ( ! src->getKeepOpen())
          src->close();
      } else if (newMask != (unsigned) -1) {
        thisIt->getMask() = newMask;
      }
    }

    // Check whether to clear all sources
    if (_doClear)
    {
      SourceList closeList = _sources;
      _sources.clear();
      for (MonitoredSource& ms: closeList) {
        XmlRpcSource* src = ms.getSource();
        assert(src);
        if (src)
          src->close();
      }
      _doClear = false;
    }

    // Check whether end time has passed
    if (0 <= _endTime && getTime() > _endTime)
      break;
  }

  _inWork = false;
}